

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_module.cpp
# Opt level: O2

shared_ptr<TestBaseType> more_derived_type_factory(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<TestBaseType> sVar2;
  _func_int **local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::make_shared<TestMoreDerivedType>();
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  in_RDI->_vptr_TestBaseType = local_18;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&in_RDI->val = _Var1._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  sVar2.super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<TestBaseType>)
         sVar2.super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TestBaseType> more_derived_type_factory() {
  return std::make_shared<TestMoreDerivedType>();
}